

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O2

void __thiscall QAccessibleDisplay::imagePosition(QAccessibleDisplay *this)

{
  imagePosition((QAccessibleDisplay *)&this[-1].super_QAccessibleWidget.field_0x8);
  return;
}

Assistant:

QPoint QAccessibleDisplay::imagePosition() const
{
#if QT_CONFIG(label)
    QLabel *label = qobject_cast<QLabel *>(widget());
    if (!label)
#endif
        return QPoint();
#if QT_CONFIG(label)
    if (label->pixmap().isNull())
        return QPoint();

    return QPoint(label->mapToGlobal(label->pos()));
#endif
}